

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

void __thiscall
cmLocalGenerator::AddLanguageFlags
          (cmLocalGenerator *this,string *flags,cmGeneratorTarget *target,string *lang,
          string *config)

{
  cmMakefile *pcVar1;
  bool bVar2;
  bool bVar3;
  char *pcVar4;
  string *psVar5;
  string *psVar6;
  string local_168;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_> cge
  ;
  string msvcRuntimeLibrary;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  string *local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  cmGeneratorExpression ge;
  cmListFileBacktrace local_c8;
  string flagsVar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&flagsVar,"CMAKE_",(allocator<char> *)&msvcRuntimeLibrary);
  local_100 = lang;
  std::__cxx11::string::append((string *)&flagsVar);
  std::__cxx11::string::append((char *)&flagsVar);
  AddConfigVariableFlags(this,flags,&flagsVar,config);
  pcVar1 = this->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&msvcRuntimeLibrary,"CMAKE_MSVC_RUNTIME_LIBRARY_DEFAULT",
             (allocator<char> *)&local_168);
  pcVar4 = cmMakefile::GetDefinition(pcVar1,&msvcRuntimeLibrary);
  std::__cxx11::string::~string((string *)&msvcRuntimeLibrary);
  if ((pcVar4 == (char *)0x0) || (*pcVar4 == '\0')) goto LAB_002917ae;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&msvcRuntimeLibrary,"MSVC_RUNTIME_LIBRARY",(allocator<char> *)&local_168);
  cmGeneratorTarget::GetProperty(target,&msvcRuntimeLibrary);
  std::__cxx11::string::~string((string *)&msvcRuntimeLibrary);
  local_c8.TopEntry.super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_c8.TopEntry.super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  cmGeneratorExpression::cmGeneratorExpression(&ge,&local_c8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_c8.TopEntry.
              super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  cmGeneratorExpression::Parse((cmGeneratorExpression *)&cge,(char *)&ge);
  local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
  local_168._M_string_length = 0;
  local_168.field_2._M_local_buf[0] = '\0';
  psVar5 = cmCompiledGeneratorExpression::Evaluate
                     ((cmCompiledGeneratorExpression *)
                      cge._M_t.
                      super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                      .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl,
                      this,config,false,target,(cmGeneratorTarget *)0x0,
                      (cmGeneratorExpressionDAGChecker *)0x0,&local_168);
  std::__cxx11::string::string((string *)&msvcRuntimeLibrary,(string *)psVar5);
  std::__cxx11::string::~string((string *)&local_168);
  psVar5 = local_100;
  if (msvcRuntimeLibrary._M_string_length != 0) {
    pcVar1 = this->Makefile;
    std::operator+(&local_f8,"CMAKE_",local_100);
    std::operator+(&local_120,&local_f8,"_COMPILE_OPTIONS_MSVC_RUNTIME_LIBRARY_");
    std::operator+(&local_168,&local_120,&msvcRuntimeLibrary);
    pcVar4 = cmMakefile::GetDefinition(pcVar1,&local_168);
    std::__cxx11::string::~string((string *)&local_168);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_f8);
    if (pcVar4 == (char *)0x0) {
      pcVar1 = this->Makefile;
      std::operator+(&local_120,"CMAKE_",psVar5);
      std::operator+(&local_168,&local_120,"_COMPILER_ID");
      psVar6 = cmMakefile::GetSafeDefinition(pcVar1,&local_168);
      bVar2 = std::operator==(psVar6,"MSVC");
      if (bVar2) {
LAB_002916a2:
        bVar3 = cmSystemTools::GetErrorOccuredFlag();
        bVar3 = !bVar3;
        if (!bVar2) goto LAB_002916b8;
      }
      else {
        pcVar1 = this->Makefile;
        std::operator+(&local_50,"CMAKE_",psVar5);
        std::operator+(&local_f8,&local_50,"_SIMULATE_ID");
        psVar6 = cmMakefile::GetSafeDefinition(pcVar1,&local_f8);
        bVar3 = std::operator==(psVar6,"MSVC");
        if (bVar3) goto LAB_002916a2;
        bVar3 = false;
LAB_002916b8:
        std::__cxx11::string::~string((string *)&local_f8);
        std::__cxx11::string::~string((string *)&local_50);
      }
      std::__cxx11::string::~string((string *)&local_168);
      std::__cxx11::string::~string((string *)&local_120);
      if (bVar3) {
        std::operator+(&local_90,"MSVC_RUNTIME_LIBRARY value \'",&msvcRuntimeLibrary);
        std::operator+(&local_70,&local_90,"\' not known for this ");
        std::operator+(&local_120,&local_70,psVar5);
        std::operator+(&local_168,&local_120," compiler.");
        IssueMessage(this,FATAL_ERROR,&local_168);
        std::__cxx11::string::~string((string *)&local_168);
        std::__cxx11::string::~string((string *)&local_120);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_90);
      }
    }
    else {
      AppendCompileOptions(this,flags,pcVar4,(char *)0x0);
    }
  }
  std::__cxx11::string::~string((string *)&msvcRuntimeLibrary);
  std::
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
  ~unique_ptr(&cge);
  cmGeneratorExpression::~cmGeneratorExpression(&ge);
LAB_002917ae:
  std::__cxx11::string::~string((string *)&flagsVar);
  return;
}

Assistant:

void cmLocalGenerator::AddLanguageFlags(std::string& flags,
                                        cmGeneratorTarget const* target,
                                        const std::string& lang,
                                        const std::string& config)
{
  // Add language-specific flags.
  std::string flagsVar = "CMAKE_";
  flagsVar += lang;
  flagsVar += "_FLAGS";
  this->AddConfigVariableFlags(flags, flagsVar, config);

  // Add MSVC runtime library flags.  This is activated by the presence
  // of a default selection whether or not it is overridden by a property.
  const char* msvcRuntimeLibraryDefault =
    this->Makefile->GetDefinition("CMAKE_MSVC_RUNTIME_LIBRARY_DEFAULT");
  if (msvcRuntimeLibraryDefault && *msvcRuntimeLibraryDefault) {
    const char* msvcRuntimeLibraryValue =
      target->GetProperty("MSVC_RUNTIME_LIBRARY");
    if (!msvcRuntimeLibraryValue) {
      msvcRuntimeLibraryValue = msvcRuntimeLibraryDefault;
    }
    cmGeneratorExpression ge;
    std::unique_ptr<cmCompiledGeneratorExpression> cge =
      ge.Parse(msvcRuntimeLibraryValue);
    std::string const msvcRuntimeLibrary =
      cge->Evaluate(this, config, false, target);
    if (!msvcRuntimeLibrary.empty()) {
      if (const char* msvcRuntimeLibraryOptions =
            this->Makefile->GetDefinition(
              "CMAKE_" + lang + "_COMPILE_OPTIONS_MSVC_RUNTIME_LIBRARY_" +
              msvcRuntimeLibrary)) {
        this->AppendCompileOptions(flags, msvcRuntimeLibraryOptions);
      } else if ((this->Makefile->GetSafeDefinition(
                    "CMAKE_" + lang + "_COMPILER_ID") == "MSVC" ||
                  this->Makefile->GetSafeDefinition(
                    "CMAKE_" + lang + "_SIMULATE_ID") == "MSVC") &&
                 !cmSystemTools::GetErrorOccuredFlag()) {
        // The compiler uses the MSVC ABI so it needs a known runtime library.
        this->IssueMessage(MessageType::FATAL_ERROR,
                           "MSVC_RUNTIME_LIBRARY value '" +
                             msvcRuntimeLibrary + "' not known for this " +
                             lang + " compiler.");
      }
    }
  }
}